

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQMDP.cpp
# Opt level: O0

void __thiscall
FactoredQLastTimeStepOrQMDP::FactoredQLastTimeStepOrQMDP
          (FactoredQLastTimeStepOrQMDP *this,void **vtt,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  sp_counted_base *pu;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *in_RDI;
  void **in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffffc7;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> local_38 [2];
  undefined8 local_18;
  
  local_18 = in_RDX;
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            ((FactoredQLastTimeStepOrElse *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
             in_stack_ffffffffffffffb8,in_RDI);
  in_RDI->px = (element_type *)*in_RSI;
  *(undefined8 *)
   ((long)&in_RDI->px +
   *(long *)&in_RDI->px[-1].super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
             _m_jointActionObservationHistoryTreeMap._M_t._M_impl.super__Rb_tree_header._M_header) =
       in_RSI[0x10];
  *(undefined8 *)
   ((long)&in_RDI->px +
   *(size_t *)
    ((long)&in_RDI->px[-1].super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
            _m_jointActionObservationHistoryTreeMap._M_t._M_impl.super__Rb_tree_header + 0x20)) =
       in_RSI[0x11];
  (in_RDI->pn).pi_ = (sp_counted_base *)in_RSI[0x12];
  *(undefined8 *)
   ((long)&in_RDI->px +
   *(long *)&in_RDI->px[-1].super_PlanningUnitDecPOMDPDiscrete.super_PlanningUnitMADPDiscrete.
             _m_jointActionObservationHistoryTreeMap._M_t._M_impl) = in_RSI[0x13];
  pu = (sp_counted_base *)operator_new(0x70);
  uVar1 = 1;
  boost::shared_ptr<PlanningUnitDecPOMDPDiscrete_const>::
  shared_ptr<PlanningUnitFactoredDecPOMDPDiscrete_const>(local_38,local_18);
  QMDP::QMDP((QMDP *)CONCAT17(in_stack_ffffffffffffffc7,CONCAT16(uVar1,in_stack_ffffffffffffffc0)),
             (shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)pu,SUB81((ulong)in_RDI >> 0x38,0));
  in_RDI[5].pn.pi_ = pu;
  boost::shared_ptr<const_PlanningUnitDecPOMDPDiscrete>::~shared_ptr
            ((shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)0x8db833);
  return;
}

Assistant:

FactoredQLastTimeStepOrQMDP::
FactoredQLastTimeStepOrQMDP(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QMDP=new QMDP( puf );
}